

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall YdiskRestClient::downloadFile(YdiskRestClient *this,string *path,ofstream *ofstream)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  SSLClient *path_00;
  bool bVar1;
  Headers *headers;
  element_type *peVar2;
  element_type *peVar3;
  Json *pJVar4;
  runtime_error *this_01;
  string *psVar5;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  string local_108;
  Json local_e8;
  undefined1 local_d8 [8];
  Json json;
  string error;
  undefined1 local_88 [8];
  shared_ptr<httplib::Response> r;
  allocator local_41;
  string local_40 [8];
  string url;
  ofstream *ofstream_local;
  string *path_local;
  YdiskRestClient *this_local;
  
  url.field_2._8_8_ = ofstream;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"/v1/disk/resources/download?path=",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  url_encode((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this,
             path);
  std::__cxx11::string::operator+=
            (local_40,(string *)
                      &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  path_00 = this->http_client;
  headers = (Headers *)std::__cxx11::string::c_str();
  std::function<bool_(unsigned_long,_unsigned_long)>::function
            ((function<bool_(unsigned_long,_unsigned_long)> *)((long)&error.field_2 + 8),
             (nullptr_t)0x0);
  httplib::Client::Get((Client *)local_88,(char *)path_00,headers,(Progress *)&this->headers);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function
            ((function<bool_(unsigned_long,_unsigned_long)> *)((long)&error.field_2 + 8));
  peVar2 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_88);
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    if (peVar3->status == 200) {
      this_00 = &json.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::__cxx11::string::string((string *)this_00);
      peVar3 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_88);
      json11::Json::parse((string *)local_d8,&peVar3->body,(JsonParse)this_00);
      json11::Json::Json(&local_e8,(Json *)local_d8);
      std::__cxx11::string::string
                ((string *)&local_108,
                 (string *)
                 &json.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      check_parsing_result(this,&local_e8,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      json11::Json::~Json(&local_e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,"href",&local_129);
      pJVar4 = json11::Json::operator[]((Json *)local_d8,&local_128);
      bVar1 = json11::Json::is_string(pJVar4);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Wrong json format");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_150,"href",&local_151);
      pJVar4 = json11::Json::operator[]((Json *)local_d8,&local_150);
      psVar5 = json11::Json::string_value_abi_cxx11_(pJVar4);
      std::__cxx11::string::operator=(local_40,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      json11::Json::~Json((Json *)local_d8);
      std::__cxx11::string::~string
                ((string *)
                 &json.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0021de80;
    }
  }
  peVar2 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_88);
  throw_response_error(this,peVar2);
LAB_0021de80:
  std::__cxx11::string::string((string *)&local_178,local_40);
  _do_download(this,&local_178,(ofstream *)url.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_178);
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_88);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void YdiskRestClient::downloadFile(std::string path, std::ofstream &ofstream)
{
    std::string url("/v1/disk/resources/download?path=");
    url += url_encode(path);

    //Get download link
    auto r = http_client->Get(url.c_str(), headers);
    if(r.get() && r->status==200){
        std::string error;
        const auto json = Json::parse(r->body, error);
        check_parsing_result(json, error);
        if(!json["href"].is_string())
            throw std::runtime_error("Wrong json format");

        url = json["href"].string_value();
    } else {
        throw_response_error(r.get());
    }

    _do_download(url, ofstream);

}